

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraigUtil.c
# Opt level: O2

void Fraig_PrintBinary(FILE *pFile,uint *pSign,int nBits)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  
  uVar1 = nBits & 0x1f;
  uVar4 = (int)((ulong)(long)nBits >> 5) + -1 + (uint)(uVar1 != 0);
  for (uVar2 = uVar4; -1 < (int)uVar2; uVar2 = uVar2 - 1) {
    uVar3 = 0x1f;
    if (uVar2 == uVar4) {
      uVar3 = uVar1 - 1;
    }
    if (uVar1 == 0) {
      uVar3 = 0x1f;
    }
    for (; -1 < (int)uVar3; uVar3 = uVar3 - 1) {
      fputc(((pSign[uVar2] >> (uVar3 & 0x1f) & 1) != 0) + 0x30,(FILE *)pFile);
    }
  }
  return;
}

Assistant:

void Fraig_PrintBinary( FILE * pFile, unsigned * pSign, int nBits )
{
    int Remainder, nWords;
    int w, i;

    Remainder = (nBits%(sizeof(unsigned)*8));
    nWords    = (nBits/(sizeof(unsigned)*8)) + (Remainder>0);

    for ( w = nWords-1; w >= 0; w-- )
        for ( i = ((w == nWords-1 && Remainder)? Remainder-1: 31); i >= 0; i-- )
            fprintf( pFile, "%c", '0' + (int)((pSign[w] & (1<<i)) > 0) );

//  fprintf( pFile, "\n" );
}